

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evalexpr.c
# Opt level: O3

void expr_eval(astnode *ptr)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (ptr != (astnode *)0x0) {
    do {
      iVar2 = ptr->type;
      lVar4 = 8;
      lVar3 = 0x10;
      if (iVar2 < 0x129) {
        uVar1 = iVar2 - 0x21;
        if (uVar1 < 0x3e) {
          if ((0x2000000028005630U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001051db;
          if ((ulong)uVar1 == 0) goto LAB_001051e4;
        }
        if (iVar2 == 0x7c) goto LAB_001051db;
        if (iVar2 != 0x7e) {
LAB_00105205:
          yyerror("Warning: Unknown expression type");
          return;
        }
      }
      else {
        if (0x12e < iVar2) {
          if (1 < iVar2 - 0x12fU) {
            if (iVar2 != 0x14b) {
              if (iVar2 == 0x170) {
                return;
              }
              goto LAB_00105205;
            }
            goto LAB_001051e4;
          }
          labelcounter = labelcounter + 1;
          lVar4 = 0x10;
          lVar3 = 8;
        }
LAB_001051db:
        expr_eval(*(astnode **)((long)&ptr->type + lVar3));
      }
LAB_001051e4:
      ptr = *(astnode **)((long)&ptr->type + lVar4);
    } while (ptr != (astnode *)0x0);
  }
  return;
}

Assistant:

void expr_eval(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		case LOR:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic or evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case LAND:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic and evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case '|':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//OR expression
			break;
			
		case '^':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//XOR expression
			break;
			
		case '&':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//AND expression
			break;
			
		case EQ:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Equality expression
			break;
			
		case NE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Non-equality expression
			break;
			
		case '>':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Larger then
			break;
			
		case '<':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Smaller then
			break;
			
		case GE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Greater then or equal to.
			break;
			
		case LE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Less then or equal to.
			break;
			
		case SHL:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift left
			break;
			
		case SHR:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift Right
			break;
			
		case '+':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Add
			break;
			
		case '-':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Subtract
			break;
			
		case '*':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Multiply
			break;
			
		case '/':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Divide
			break;
			
		case '%':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Modulo
			break;	
			
		case NEGATE:
			expr_eval(ptr->left);
			//Negate
			break;
			
		case '~':
			expr_eval(ptr->left);
			//Not
			break;
		
		case '!':
			expr_eval(ptr->left);
			//Logical not
			break;
			
		case ICONSTANT:
		{
			struct numbernode *num=(struct numbernode *)ptr;
			//Get number 
			break;
		}
		default:
			yyerror("Warning: Unknown expression type");
			break;
		
	}
	
	return;
	
}